

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,RegList l)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  int i_1;
  int i;
  long lVar4;
  ulong uVar5;
  Rn rn;
  int r [16];
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    r[lVar4] = (uint)((l.raw >> ((uint)lVar4 & 0x1f) & 1) != 0);
  }
  for (lVar4 = 1; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    if (r[lVar4] != 0) {
      r[lVar4] = r[lVar4 + -1] + 1;
    }
  }
  uVar1 = 0xf;
  while (uVar5 = uVar1, uVar1 = uVar5 - 1, -1 < (int)uVar1) {
    if ((r[uVar1 & 0xffffffff] != 0) && (r[uVar5] != 0)) {
      r[uVar1 & 0xffffffff] = r[uVar5];
    }
  }
  bVar3 = true;
  for (rn.raw = 0; rn.raw < 0x10; rn.raw = rn.raw + iVar2 + 1) {
    iVar2 = r[rn.raw];
    if (iVar2 != 0) {
      if (!bVar3) {
        operator<<(this,"/");
      }
      operator<<(this,rn);
      if (iVar2 != 1) {
        operator<<(this,"-");
        operator<<(this,(Rn)(rn.raw + iVar2 + -1));
      }
      bVar3 = false;
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(RegList l)
{
    int r[16];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 15; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 15; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 14; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "D0-D2/D4/D5/D7"
    bool first = true;
    for (int i = 0; i <= 15; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Rn{i}; }

        // Format variant 2: Register range
        else { *this << Rn{i} << "-" << Rn{i+r[i]-1}; }
    }

    return *this;
}